

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# operats.c
# Opt level: O1

double MaxNorm_V(Vector *V)

{
  double dVar1;
  LASErrIdType LVar2;
  ulong uVar3;
  double local_18;
  
  V_Lock(V);
  LVar2 = LASResult();
  if (LVar2 == LASOK) {
    if (V->Dim == 0) {
      local_18 = 0.0;
    }
    else {
      local_18 = 0.0;
      uVar3 = 1;
      do {
        dVar1 = ABS(V->Cmp[uVar3]);
        if (ABS(V->Cmp[uVar3]) <= local_18) {
          dVar1 = local_18;
        }
        local_18 = dVar1;
        uVar3 = uVar3 + 1;
      } while (uVar3 <= V->Dim);
    }
    local_18 = local_18 * V->Multipl;
  }
  else {
    local_18 = 1.0;
  }
  V_Unlock(V);
  return local_18;
}

Assistant:

double MaxNorm_V(Vector *V)
/* SRes = max-Norm of the vector V */
{
    double SRes;

    double MaxCmp, Cmp;
    size_t Dim, Ind;
    Real *VCmp;

    V_Lock(V);
    
    if (LASResult() == LASOK) {
        Dim = V->Dim;
        VCmp = V->Cmp;
        MaxCmp = 0.0;
        for_AllCmp {
           Cmp = fabs(VCmp[Ind]);
           if (Cmp > MaxCmp) 
               MaxCmp = Cmp;
        }
        MaxCmp *= V->Multipl;
        SRes = MaxCmp;
    } else {
        SRes = 1.0;
    }

    V_Unlock(V);

    return(SRes);
}